

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

int nni_sock_add_listener(nni_sock *s,nni_listener *l)

{
  long lVar1;
  nni_ep_option *o;
  uint64_t val;
  int i;
  int rv;
  nni_listener *l_local;
  nni_sock *s_local;
  
  _i = l;
  l_local = (nni_listener *)s;
  s_local._4_4_ = nni_listener_hold(l);
  if (s_local._4_4_ == 0) {
    val._0_4_ = 0;
    val._4_4_ = 0;
    while (ep_options[(int)val].eo_name != (char *)0x0) {
      lVar1 = (long)(int)val;
      val._4_4_ = nni_sock_getopt((nni_sock *)l_local,ep_options[lVar1].eo_name,&o,(size_t *)0x0,
                                  ep_options[lVar1].eo_type);
      if (val._4_4_ == 0) {
        val._4_4_ = nni_listener_setopt(_i,ep_options[lVar1].eo_name,&o,0,ep_options[lVar1].eo_type)
        ;
      }
      if ((val._4_4_ != 0) && (val._4_4_ != 9)) {
        nni_listener_rele(_i);
        return val._4_4_;
      }
      val._0_4_ = (int)val + 1;
    }
    nni_mtx_lock((nni_mtx *)&(l_local->l_ops).l_fini);
    if (((ulong)(l_local->l_acc_aio).a_outputs[1] & 1) == 0) {
      nni_list_append((nni_list *)&(l_local->l_acc_aio).a_iov[5].iov_len,_i);
      nni_stat_inc((nni_stat_item *)&(l_local->l_tmo_aio).a_iov[6].iov_len,1);
      nni_mtx_unlock((nni_mtx *)&(l_local->l_ops).l_fini);
      s_local._4_4_ = 0;
    }
    else {
      nni_mtx_unlock((nni_mtx *)&(l_local->l_ops).l_fini);
      nni_listener_rele(_i);
      s_local._4_4_ = 7;
    }
  }
  return s_local._4_4_;
}

Assistant:

int
nni_sock_add_listener(nni_sock *s, nni_listener *l)
{
	int rv;

	// grab a hold on the listener for the socket
	if ((rv = nni_listener_hold(l)) != 0) {
		return (rv);
	}

	// copy initial values for some options from socket
	for (int i = 0; ep_options[i].eo_name != NULL; i++) {
		uint64_t             val; // big enough
		const nni_ep_option *o = &ep_options[i];
		rv = nni_sock_getopt(s, o->eo_name, &val, NULL, o->eo_type);
		if (rv == 0) {
			rv = nni_listener_setopt(
			    l, o->eo_name, &val, 0, o->eo_type);
		}
		if (rv != 0 && rv != NNG_ENOTSUP) {
			nni_listener_rele(l);
			return (rv);
		}
	}

	nni_mtx_lock(&s->s_mx);
	if (s->s_closing) {
		nni_mtx_unlock(&s->s_mx);
		nni_listener_rele(l);
		return (NNG_ECLOSED);
	}

	nni_list_append(&s->s_listeners, l);

#ifdef NNG_ENABLE_STATS
	nni_stat_inc(&s->st_listeners, 1);
#endif

	nni_mtx_unlock(&s->s_mx);
	return (0);
}